

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BoxCoordinatesMode * __thiscall
CoreML::Specification::CropResizeLayerParams::mutable_boxindicesmode(CropResizeLayerParams *this)

{
  BoxCoordinatesMode *this_00;
  CropResizeLayerParams *this_local;
  
  if (this->boxindicesmode_ == (BoxCoordinatesMode *)0x0) {
    this_00 = (BoxCoordinatesMode *)operator_new(0x18);
    BoxCoordinatesMode::BoxCoordinatesMode(this_00);
    this->boxindicesmode_ = this_00;
  }
  return this->boxindicesmode_;
}

Assistant:

inline ::CoreML::Specification::BoxCoordinatesMode* CropResizeLayerParams::mutable_boxindicesmode() {
  
  if (boxindicesmode_ == NULL) {
    boxindicesmode_ = new ::CoreML::Specification::BoxCoordinatesMode;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CropResizeLayerParams.boxIndicesMode)
  return boxindicesmode_;
}